

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void queued_activate(QObject *sender,int signal,Connection *c,void **argv)

{
  bool bVar1;
  int iVar2;
  Type pQVar3;
  QMetaCallEvent *this;
  void **ppvVar4;
  Connection *c_00;
  void *pvVar5;
  long in_RDX;
  uint in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int n_1;
  int n;
  QMetaType *types;
  void **args;
  QMetaCallEvent *ev;
  QObject *receiver;
  int nargs;
  int *argumentTypes;
  SlotObjectGuard slotObjectGuard;
  QMetaMethod m;
  QMutexLocker<QBasicMutex> locker;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  QMutexLocker<QBasicMutex> *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  QObject *in_stack_ffffffffffffff00;
  QSlotObjectBase *in_stack_ffffffffffffff08;
  QMetaCallEvent *in_stack_ffffffffffffff10;
  QMetaCallEvent *copy;
  QMetaCallEvent *in_stack_ffffffffffffff18;
  QMetaCallEvent *this_00;
  QEvent *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QMetaMethod *in_stack_ffffffffffffff50;
  int local_6c;
  QEvent *local_68;
  anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 local_40;
  anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 local_38;
  undefined1 *local_30;
  __sighandler_t local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = (QEvent *)
             QBasicAtomicPointer<const_int>::loadRelaxed((QBasicAtomicPointer<const_int> *)0x3fc658)
  ;
  if (local_68 == (QEvent *)0x0) {
    local_28 = (__sighandler_t)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    iVar2 = (**(code **)*in_RDI)();
    local_28 = QMetaObjectPrivate::signal(iVar2,(__sighandler_t)(ulong)in_ESI);
    local_68 = (QEvent *)queuedConnectionTypes(in_stack_ffffffffffffff50);
    if (local_68 == (QEvent *)0x0) {
      local_68 = (QEvent *)&DIRECT_CONNECTION_ONLY;
    }
    bVar1 = QBasicAtomicPointer<const_int>::testAndSetOrdered
                      ((QBasicAtomicPointer<const_int> *)in_stack_fffffffffffffee0,
                       (Type)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (Type)0x3fc705);
    if (!bVar1) {
      if ((local_68 != (QEvent *)&DIRECT_CONNECTION_ONLY) &&
         (in_stack_ffffffffffffff28 = local_68, local_68 != (QEvent *)0x0)) {
        operator_delete__(local_68);
        in_stack_ffffffffffffff28 = local_68;
      }
      local_68 = (QEvent *)
                 QBasicAtomicPointer<const_int>::loadRelaxed
                           ((QBasicAtomicPointer<const_int> *)0x3fc74a);
    }
  }
  if (local_68 != (QEvent *)&DIRECT_CONNECTION_ONLY) {
    local_6c = 1;
    while (*(int *)((long)&local_68->_vptr_QEvent + (long)(local_6c + -1) * 4) != 0) {
      local_6c = local_6c + 1;
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x3fc7d2);
    signalSlotLock(pQVar3);
    QMutexLocker<QBasicMutex>::QMutexLocker
              (in_stack_fffffffffffffee0,
               (QBasicMutex *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    pQVar3 = QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x3fc7fb);
    if (pQVar3 != (Type)0x0) {
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      if (((ushort)((uint)*(undefined4 *)(in_RDX + 0x54) >> 0x1d) & 1) == 0) {
        this_00 = (QMetaCallEvent *)0x0;
      }
      else {
        this_00 = *(QMetaCallEvent **)(in_RDX + 0x38);
      }
      SlotObjectGuard::SlotObjectGuard
                ((SlotObjectGuard *)in_stack_fffffffffffffee0,
                 (QSlotObjectBase *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QMutexLocker<QBasicMutex>::unlock(in_stack_fffffffffffffee0);
      if ((*(uint *)(in_RDX + 0x54) >> 0x1d & 1) == 0) {
        this = (QMetaCallEvent *)operator_new(0x78);
        QMetaCallEvent::QMetaCallEvent
                  (this_00,(ushort)((ulong)in_stack_ffffffffffffff18 >> 0x30),
                   (ushort)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                   (StaticMetaCallFunction)in_stack_ffffffffffffff10,(QObject *)this,
                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_ffffffffffffff30);
      }
      else {
        this = (QMetaCallEvent *)operator_new(0x78);
        QMetaCallEvent::QMetaCallEvent
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff18 = this;
      }
      copy = this;
      ppvVar4 = QMetaCallEvent::args(this);
      c_00 = (Connection *)QMetaCallEvent::types(this);
      memset(&local_38,0,8);
      QMetaType::QMetaType((QMetaType *)&local_38.nextInOrphanList);
      iVar2 = (int)((ulong)this_00 >> 0x20);
      (c_00->super_ConnectionOrSignalVector).field_0 = local_38;
      *ppvVar4 = (void *)0x0;
      if (1 < local_6c) {
        for (in_stack_ffffffffffffff34 = 1; in_stack_ffffffffffffff34 < local_6c;
            in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 + 1) {
          QMetaType::QMetaType((QMetaType *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          (&c_00->super_ConnectionOrSignalVector)[in_stack_ffffffffffffff34].field_0 = local_40;
        }
        for (in_stack_ffffffffffffff30 = 1; iVar2 = (int)((ulong)this_00 >> 0x20),
            in_stack_ffffffffffffff30 < local_6c;
            in_stack_ffffffffffffff30 = in_stack_ffffffffffffff30 + 1) {
          pvVar5 = QMetaType::create((QMetaType *)in_stack_ffffffffffffff18,copy);
          ppvVar4[in_stack_ffffffffffffff30] = pvVar5;
        }
      }
      if ((-1 < *(int *)(in_RDX + 0x54)) || (bVar1 = QObjectPrivate::removeConnection(c_00), bVar1))
      {
        QMutexLocker<QBasicMutex>::relock(in_stack_fffffffffffffee0);
        if ((*(int *)(in_RDX + 0x54) < 0) ||
           (pQVar3 = QBasicAtomicPointer<QObject>::loadRelaxed
                               ((QBasicAtomicPointer<QObject> *)0x3fcbd9), pQVar3 != (Type)0x0)) {
          QCoreApplication::postEvent
                    ((QObject *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28,iVar2);
        }
        else {
          QMutexLocker<QBasicMutex>::unlock(in_stack_fffffffffffffee0);
          if (this != (QMetaCallEvent *)0x0) {
            (*(this->super_QAbstractMetaCallEvent).super_QEvent._vptr_QEvent[1])();
          }
        }
      }
      else if (this != (QMetaCallEvent *)0x0) {
        (*(this->super_QAbstractMetaCallEvent).super_QEvent._vptr_QEvent[1])();
      }
      SlotObjectGuard::~SlotObjectGuard((SlotObjectGuard *)0x3fcc48);
    }
    QMutexLocker<QBasicMutex>::~QMutexLocker(in_stack_fffffffffffffee0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void queued_activate(QObject *sender, int signal, QObjectPrivate::Connection *c, void **argv)
{
    const int *argumentTypes = c->argumentTypes.loadRelaxed();
    if (!argumentTypes) {
        QMetaMethod m = QMetaObjectPrivate::signal(sender->metaObject(), signal);
        argumentTypes = queuedConnectionTypes(m);
        if (!argumentTypes) // cannot queue arguments
            argumentTypes = &DIRECT_CONNECTION_ONLY;
        if (!c->argumentTypes.testAndSetOrdered(nullptr, argumentTypes)) {
            if (argumentTypes != &DIRECT_CONNECTION_ONLY)
                delete[] argumentTypes;
            argumentTypes = c->argumentTypes.loadRelaxed();
        }
    }
    if (argumentTypes == &DIRECT_CONNECTION_ONLY) // cannot activate
        return;
    int nargs = 1; // include return type
    while (argumentTypes[nargs - 1])
        ++nargs;

    QMutexLocker locker(signalSlotLock(c->receiver.loadRelaxed()));
    QObject *receiver = c->receiver.loadRelaxed();
    if (!receiver) {
        // the connection has been disconnected before we got the lock
        return;
    }

    SlotObjectGuard slotObjectGuard { c->isSlotObject ? c->slotObj : nullptr };
    locker.unlock();

    QMetaCallEvent *ev = c->isSlotObject ?
        new QMetaCallEvent(c->slotObj, sender, signal, nargs) :
        new QMetaCallEvent(c->method_offset, c->method_relative, c->callFunction, sender, signal, nargs);

    void **args = ev->args();
    QMetaType *types = ev->types();

    types[0] = QMetaType(); // return type
    args[0] = nullptr; // return value

    if (nargs > 1) {
        for (int n = 1; n < nargs; ++n)
            types[n] = QMetaType(argumentTypes[n - 1]);

        for (int n = 1; n < nargs; ++n)
            args[n] = types[n].create(argv[n]);
    }

    if (c->isSingleShot && !QObjectPrivate::removeConnection(c)) {
        delete ev;
        return;
    }

    locker.relock();
    if (!c->isSingleShot && !c->receiver.loadRelaxed()) {
        // the connection has been disconnected while we were unlocked
        locker.unlock();
        delete ev;
        return;
    }

    QCoreApplication::postEvent(receiver, ev);
}